

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O1

bool __thiscall
cappuccino::
ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>
::do_insert_update(ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>
                   *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                  bool *value,time_point expire_time,allow a)

{
  list<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element>_>
  *this_00;
  _Base_ptr p_Var1;
  uint in_EAX;
  iterator iVar2;
  __off64_t *__offout;
  size_t in_R9;
  
  __offout = (__off64_t *)a;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::keyed_element>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::keyed_element>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::keyed_element>_>_>
          ::find(&(this->m_keyed_elements)._M_t,key);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->m_keyed_elements)._M_t._M_impl.super__Rb_tree_header) {
    if ((a & insert) == 0) {
      return false;
    }
    do_insert(this,key,value,expire_time);
  }
  else {
    if ((a & update) == 0) {
      return false;
    }
    *(bool *)&iVar2._M_node[2]._M_color = *value;
    p_Var1 = iVar2._M_node[2]._M_parent;
    p_Var1->_M_left = (_Base_ptr)expire_time.__d.__r;
    this_00 = &this->m_ttl_list;
    std::__cxx11::
    list<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element>_>
    ::splice(this_00,(int)this_00,(__off64_t *)this_00,(int)p_Var1,__offout,in_R9,in_EAX);
    iVar2._M_node[2]._M_parent =
         (_Base_ptr)
         (this->m_ttl_list).
         super__List_base<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element>_>
         ._M_impl._M_node.super__List_node_base._M_prev;
  }
  return true;
}

Assistant:

auto do_insert_update(
        const key_type& key, value_type&& value, std::chrono::steady_clock::time_point expire_time, allow a) -> bool
    {
        const auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            if (update_allowed(a))
            {
                do_update(keyed_position, std::move(value), expire_time);
                return true;
            }
        }
        else
        {
            if (insert_allowed(a))
            {
                do_insert(key, std::move(value), expire_time);
                return true;
            }
        }
        return false;
    }